

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* CTandCTOTReadCoder(string *reference,string *sequence,
                    vector<int,_std::allocator<int>_> *qualityList,char char1,char char2,char char3)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  ulong uVar1;
  long lVar2;
  char *pcVar3;
  reference pvVar4;
  long lVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  string *this;
  char in_R8B;
  char in_R9B;
  char in_stack_00000008;
  int i;
  int counter;
  bool endChecker;
  string codedReadQualities;
  string codedRead;
  char *in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb98;
  allocator_type *in_stack_fffffffffffffbb8;
  string *psVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffbc0;
  iterator pbVar7;
  size_type in_stack_fffffffffffffbd0;
  char *in_stack_fffffffffffffbd8;
  int __val;
  undefined1 local_329 [9];
  string local_320 [32];
  string local_300 [32];
  string *local_2e0;
  undefined8 local_2d8;
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [36];
  int local_8c;
  int local_88;
  byte local_82;
  allocator local_81;
  string local_80 [55];
  allocator local_49;
  string local_48 [38];
  char local_22;
  char local_21;
  
  local_22 = in_R9B;
  local_21 = in_R8B;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"",&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"",&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  local_88 = 0;
  local_8c = 0;
  do {
    uVar1 = (ulong)local_8c;
    lVar2 = std::__cxx11::string::size();
    __val = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
    if (lVar2 - 2U <= uVar1) {
LAB_0027dcca:
      if ((local_88 == 0) || (local_88 == -1)) {
        if (local_88 != -1) {
          if ((local_82 & 1) == 0) {
            std::__cxx11::to_string(__val);
            std::__cxx11::string::operator+=(local_48,local_2b0);
            std::__cxx11::string::~string(local_2b0);
            std::__cxx11::to_string(__val);
            std::__cxx11::string::operator+=(local_80,local_2d0);
            std::__cxx11::string::~string(local_2d0);
          }
          else {
            std::__cxx11::to_string(__val);
            std::__cxx11::string::operator+=(local_48,local_270);
            std::__cxx11::string::~string(local_270);
            std::__cxx11::to_string(__val);
            std::__cxx11::string::operator+=(local_80,local_290);
            std::__cxx11::string::~string(local_290);
          }
        }
      }
      else {
        std::__cxx11::to_string(__val);
        std::__cxx11::string::operator+=(local_48,local_230);
        std::__cxx11::string::~string(local_230);
        std::__cxx11::to_string(__val);
        std::__cxx11::string::operator+=(local_80,local_250);
        std::__cxx11::string::~string(local_250);
      }
      local_329._1_8_ = local_320;
      std::__cxx11::string::string((string *)local_329._1_8_,local_48);
      local_329._1_8_ = local_300;
      std::__cxx11::string::string((string *)local_329._1_8_,local_80);
      local_2e0 = local_320;
      local_2d8 = 2;
      pbVar7 = (iterator)local_329;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x27dfce);
      __l._M_len = in_stack_fffffffffffffbd0;
      __l._M_array = pbVar7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(in_stack_fffffffffffffbc0,__l,in_stack_fffffffffffffbb8);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x27dfff);
      psVar6 = local_320;
      this = (string *)&local_2e0;
      do {
        this = this + -0x20;
        std::__cxx11::string::~string(this);
      } while (this != psVar6);
      std::__cxx11::string::~string(local_80);
      std::__cxx11::string::~string(local_48);
      return in_RDI;
    }
    local_88 = local_88 + 1;
    pcVar3 = (char *)std::__cxx11::string::at(in_RDX);
    if (((*pcVar3 == local_21) &&
        (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 == local_22)) &&
       (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 != local_21)) {
      pcVar3 = (char *)std::__cxx11::string::at(in_RSI);
      if ((*pcVar3 == local_22) &&
         (pcVar3 = (char *)std::__cxx11::string::at(in_RSI), *pcVar3 == local_21)) {
        if (local_88 == 1) {
          std::__cxx11::string::operator+=(local_48,"O");
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_8c + 1));
          std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
        }
        else {
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
          std::__cxx11::string::operator+=(local_48,local_b0);
          std::__cxx11::string::~string(local_b0);
          std::__cxx11::string::~string(local_d0);
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          std::__cxx11::string::operator+=(local_80,local_f0);
          std::__cxx11::string::~string(local_f0);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_8c + 1));
          std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
        }
        local_8c = local_8c + 1;
        local_88 = 0;
        goto LAB_0027d623;
      }
    }
    else {
      pcVar3 = (char *)std::__cxx11::string::at(in_RDX);
      if (((*pcVar3 == local_21) &&
          (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 == in_stack_00000008)) &&
         (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 != local_21)) {
        pcVar3 = (char *)std::__cxx11::string::at(in_RSI);
        if ((*pcVar3 != local_22) ||
           (pcVar3 = (char *)std::__cxx11::string::at(in_RSI), *pcVar3 != local_21))
        goto LAB_0027dcb4;
        if (local_88 == 1) {
          std::__cxx11::string::operator+=(local_48,"C");
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_8c + 1));
          std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
        }
        else {
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
          std::__cxx11::string::operator+=(local_48,local_110);
          std::__cxx11::string::~string(local_110);
          std::__cxx11::string::~string(local_130);
          std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
          std::__cxx11::string::operator+=(local_80,local_150);
          std::__cxx11::string::~string(local_150);
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](in_RCX,(long)(local_8c + 1));
          std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
        }
        local_8c = local_8c + 1;
        local_88 = 0;
      }
LAB_0027d623:
      uVar1 = (ulong)local_8c;
      lVar2 = std::__cxx11::string::size();
      if (lVar2 - 3U <= uVar1) {
        local_8c = local_8c + 1;
        lVar2 = (long)local_8c;
        lVar5 = std::__cxx11::string::size();
        if (lVar2 == lVar5 + -2) {
          local_82 = 1;
          pcVar3 = (char *)std::__cxx11::string::at(in_RDX);
          if (((*pcVar3 == local_21) &&
              (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 == local_22)) &&
             (pcVar3 = (char *)std::__cxx11::string::at(in_RSI), *pcVar3 != local_21)) {
            local_88 = local_88 + 1;
            pcVar3 = (char *)std::__cxx11::string::at(in_RSI);
            __val = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
            if (*pcVar3 == local_22) {
              pcVar3 = (char *)std::__cxx11::string::at(in_RSI);
              __val = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
              if (*pcVar3 == local_21) {
                if (local_88 == 1) {
                  std::__cxx11::string::operator+=(local_48,"O");
                  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_RCX,(long)(local_8c + 1));
                  std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
                }
                else {
                  std::__cxx11::to_string(__val);
                  std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
                  std::__cxx11::string::operator+=(local_48,local_170);
                  std::__cxx11::string::~string(local_170);
                  std::__cxx11::string::~string(local_190);
                  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
                  std::__cxx11::string::operator+=(local_80,local_1b0);
                  std::__cxx11::string::~string(local_1b0);
                  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_RCX,(long)(local_8c + 1));
                  std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
                }
                local_8c = local_8c + 1;
                local_88 = -1;
                goto LAB_0027dcb4;
              }
            }
            local_88 = local_88 + -1;
            goto LAB_0027dcca;
          }
          pcVar3 = (char *)std::__cxx11::string::at(in_RDX);
          if (((*pcVar3 == local_21) &&
              (pcVar3 = (char *)std::__cxx11::string::at(in_RDX), *pcVar3 == in_stack_00000008)) &&
             (pcVar3 = (char *)std::__cxx11::string::at(in_RSI), *pcVar3 != local_21)) {
            local_88 = local_88 + 1;
            pcVar3 = (char *)std::__cxx11::string::at(in_RSI);
            if ((*pcVar3 != local_22) ||
               (in_stack_fffffffffffffbd8 = (char *)std::__cxx11::string::at(in_RSI),
               *in_stack_fffffffffffffbd8 != local_21)) {
              __val = (int)((ulong)in_stack_fffffffffffffbd8 >> 0x20);
              local_88 = local_88 + -1;
              goto LAB_0027dcca;
            }
            if (local_88 == 1) {
              std::__cxx11::string::operator+=(local_48,"C");
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_RCX,(long)(local_8c + 1));
              std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
            }
            else {
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              std::operator+(in_stack_fffffffffffffb98,in_stack_fffffffffffffb90);
              std::__cxx11::string::operator+=(local_48,local_1d0);
              std::__cxx11::string::~string(local_1d0);
              std::__cxx11::string::~string(local_1f0);
              std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffbd8 >> 0x20));
              std::__cxx11::string::operator+=(local_80,local_210);
              std::__cxx11::string::~string(local_210);
              pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                                 (in_RCX,(long)(local_8c + 1));
              std::__cxx11::string::operator+=(local_80,(char)*pvVar4);
            }
            local_8c = local_8c + 1;
            local_88 = -1;
          }
        }
        else {
          in_stack_fffffffffffffbd0 = (size_type)local_8c;
          lVar2 = std::__cxx11::string::size();
          if (in_stack_fffffffffffffbd0 == lVar2 - 1U) {
            local_82 = 0;
          }
        }
      }
    }
LAB_0027dcb4:
    local_8c = local_8c + 1;
  } while( true );
}

Assistant:

std::vector<string> CTandCTOTReadCoder(string reference,string sequence,vector<int> qualityList,char char1,char char2,char char3){

    string codedRead = "";
    string codedReadQualities = "";
    bool endChecker;
    int counter = 0;

    for(int i =0; i<sequence.size()-2 ; i++){
        counter ++;
        if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }

            if(counter == 1){
                codedRead += "O";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "O";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }
            i += 1;
            counter = 0;
        }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (sequence.at(i+2)!=char1)){
            if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                continue;
            }
            if(counter == 1){
                codedRead += "C";
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }else{
                codedRead += std::to_string(counter-1) + "C";
                codedReadQualities += std::to_string(counter-1);
                codedReadQualities += static_cast<char> (qualityList[i+1]);
            }

            i += 1;
            counter = 0;
        }
        //This portion is specifically for calculating the last three nucleotides in the read sequence
        if(i>=sequence.size()-3){
            i++;
            if(i==sequence.size()-2){
                endChecker = true;
                if((sequence.at(i)==char1) && (sequence.at(i+1)==char2) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2 || reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "O";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "O";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }
                    i += 1;
                    counter = -1;

                }else if((sequence.at(i)==char1) && (sequence.at(i+1)==char3) && (reference.at(i+2)!=char1)){
                    counter++;
                    if(reference.at(i+1)!=char2|| reference.at(i)!=char1){
                        counter-=1;
                        break;
                    }
                    if(counter == 1){
                        codedRead += "C";
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }else{
                        codedRead += std::to_string(counter-1) + "C";
                        codedReadQualities += std::to_string(counter-1);
                        codedReadQualities += static_cast<char> (qualityList[i+1]);
                    }

                    i += 1;
                    counter = -1;
                }

            }else if(i==sequence.size()-1){
                endChecker = false;
            }
        }

    }
    if(counter!=0 && counter!=-1){
        codedRead += std::to_string(counter+2);
        codedReadQualities += std::to_string(counter+2);
    }else if(counter!=-1){
        if(endChecker){
            codedRead += std::to_string(counter+2);
            codedReadQualities += std::to_string(counter+2);
        }else{
            codedRead += std::to_string(counter+1);
            codedReadQualities += std::to_string(counter+1);
        }
    }

    return {codedRead,codedReadQualities};

}